

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::emplace_at<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>
           *this,iterator iter,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  anon_class_24_3_7b445c64 f;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  reference key_00;
  anon_union_8_1_a8a14541_for_iterator_2 local_58;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_50;
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  anon_union_8_1_a8a14541_for_iterator_2 aStack_40;
  iterator local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  
  local_58 = iter.field_1;
  local_48 = (anon_union_8_1_a8a14541_for_iterator_2)iter.ctrl_;
  local_38.field_1.slot_ = (slot_type *)&local_58;
  local_38.ctrl_ = (ctrl_t *)this;
  f.slot = (slot_type **)&local_58;
  f.this = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
  f.args = args;
  aStack_40 = local_58;
  local_28 = args;
  CommonFields::
  RunWithReentrancyGuard<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::__cxx11::string>>::construct<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string&&)::_lambda()_1_>
            ((CommonFields *)this,f);
  key_00 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator::operator*((iterator *)&local_48);
  local_38 = find<std::__cxx11::string>(this,key_00);
  local_58 = local_48;
  aStack_50 = aStack_40;
  bVar1 = container_internal::operator==(&local_38,(iterator *)&local_58);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>, Args = <std::basic_string<char>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }